

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::ProcessNoImplicitCallUses(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  RegOpnd *this_00;
  StackSym *stackSym;
  ArrayRegOpnd *arrayRegOpnd;
  SymOpnd *pSVar6;
  Opnd *pOVar7;
  OpCode OVar8;
  StackSym *this_01;
  long lVar9;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 *local_48;
  Instr *local_40;
  OpCode local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1134,"(instr)","instr");
    if (!bVar2) goto LAB_003caafc;
    *puVar5 = 0;
  }
  OVar8 = instr->m_opcode;
  if (OVar8 == NoImplicitCallUses) {
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113a,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
      if (!bVar2) goto LAB_003caafc;
      *puVar5 = 0;
    }
    if (instr->m_dst != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113b,"(!instr->GetDst())","!instr->GetDst()");
      if (!bVar2) goto LAB_003caafc;
      *puVar5 = 0;
    }
    pOVar7 = instr->m_src1;
    if (pOVar7 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113c,"(instr->GetSrc1())","instr->GetSrc1()");
      if (!bVar2) goto LAB_003caafc;
      *puVar5 = 0;
      pOVar7 = instr->m_src1;
    }
    bVar2 = IR::Opnd::IsRegOpnd(pOVar7);
    if ((!bVar2) && (bVar2 = IR::Opnd::IsSymOpnd(instr->m_src1), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113d,"(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd())",
                         "instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd()");
      if (!bVar2) goto LAB_003caafc;
      *puVar5 = 0;
    }
    if (((instr->m_src2 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsRegOpnd(instr->m_src2), !bVar2)) &&
       (bVar2 = IR::Opnd::IsSymOpnd(instr->m_src2), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113e,
                         "(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd())"
                         ,
                         "!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd()"
                        );
      if (!bVar2) {
LAB_003caafc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (this->isCollectionPass == false) {
      local_58 = *(undefined4 *)&instr->m_src1;
      uStack_54 = *(undefined4 *)((long)&instr->m_src1 + 4);
      uStack_50 = *(undefined4 *)&instr->m_src2;
      uStack_4c = *(undefined4 *)((long)&instr->m_src2 + 4);
      local_40 = instr;
      local_34 = OVar8;
      local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (lVar9 = 0;
          (puVar5 = local_48, lVar9 != 2 &&
          (pOVar7 = *(Opnd **)(&local_58 + lVar9 * 2), pOVar7 != (Opnd *)0x0)); lVar9 = lVar9 + 1) {
        OVar3 = IR::Opnd::GetKind(pOVar7);
        if (OVar3 == OpndKindSym) {
          pSVar6 = IR::Opnd::AsSymOpnd(pOVar7);
          this_01 = (StackSym *)pSVar6->m_sym;
          if ((this_01->super_Sym).m_kind != SymKindProperty) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x115e,"(sym->IsPropertySym())","sym->IsPropertySym()");
            if (!bVar2) goto LAB_003caafc;
            *puVar5 = 0;
          }
LAB_003caa3a:
          arrayRegOpnd = (ArrayRegOpnd *)0x0;
        }
        else {
          if (OVar3 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_48 = 1;
            Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1162,"(false)","false");
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          this_00 = IR::Opnd::AsRegOpnd(pOVar7);
          this_01 = this_00->m_sym;
          BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                            (this->considerSymsAsRealUsesInNoImplicitCallUses,
                             (this_01->super_Sym).m_id);
          if (BVar4 != '\0') {
            stackSym = Sym::AsStackSym(&this_01->super_Sym);
            ProcessStackSymUse(this,stackSym,'\x01');
          }
          bVar2 = IR::RegOpnd::IsArrayRegOpnd(this_00);
          if (!bVar2) goto LAB_003caa3a;
          arrayRegOpnd = IR::RegOpnd::AsArrayRegOpnd(this_00);
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->currentBlock->noImplicitCallUses,(this_01->super_Sym).m_id);
        local_32[0] = (pOVar7->m_valueType).field_0;
        bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
        if (bVar2) {
          bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
          if (bVar2) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNoMissingValuesUses,
                       (this_01->super_Sym).m_id);
          }
          bVar2 = ValueType::HasVarElements((ValueType *)&local_32[0].field_0);
          if (!bVar2) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNativeArrayUses,(this_01->super_Sym).m_id);
          }
          if (arrayRegOpnd != (ArrayRegOpnd *)0x0) {
            ProcessArrayRegOpndUse(this,local_40,arrayRegOpnd);
          }
        }
      }
      OVar8 = local_34;
      if (this->currentPrePassLoop == (Loop *)0x0) {
        BasicBlock::RemoveInstr(this->currentBlock,local_40);
        OVar8 = local_34;
      }
    }
  }
  return OVar8 == NoImplicitCallUses;
}

Assistant:

bool
BackwardPass::ProcessNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(instr);

    if(instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        return false;
    }
    Assert(tag == Js::DeadStorePhase);
    Assert(!instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd());
    Assert(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd());

    if(IsCollectionPass())
    {
        return true;
    }

    IR::Opnd *const srcs[] = { instr->GetSrc1(), instr->GetSrc2() };
    for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]) && srcs[i]; ++i)
    {
        IR::Opnd *const src = srcs[i];
        IR::ArrayRegOpnd *arraySrc = nullptr;
        Sym *sym = nullptr;
        switch(src->GetKind())
        {
            case IR::OpndKindReg:
            {
                IR::RegOpnd *const regSrc = src->AsRegOpnd();
                sym = regSrc->m_sym;
                if(considerSymsAsRealUsesInNoImplicitCallUses->TestAndClear(sym->m_id))
                {
                    ProcessStackSymUse(sym->AsStackSym(), true);
                }
                if(regSrc->IsArrayRegOpnd())
                {
                    arraySrc = regSrc->AsArrayRegOpnd();
                }
                break;
            }

            case IR::OpndKindSym:
                sym = src->AsSymOpnd()->m_sym;
                Assert(sym->IsPropertySym());
                break;

            default:
                Assert(false);
                __assume(false);
        }

        currentBlock->noImplicitCallUses->Set(sym->m_id);
        const ValueType valueType(src->GetValueType());
        if(valueType.IsArrayOrObjectWithArray())
        {
            if(valueType.HasNoMissingValues())
            {
                currentBlock->noImplicitCallNoMissingValuesUses->Set(sym->m_id);
            }
            if(!valueType.HasVarElements())
            {
                currentBlock->noImplicitCallNativeArrayUses->Set(sym->m_id);
            }
            if(arraySrc)
            {
                ProcessArrayRegOpndUse(instr, arraySrc);
            }
        }
    }

    if(!IsPrePass())
    {
        currentBlock->RemoveInstr(instr);
    }
    return true;
}